

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O0

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
anon_unknown.dwarf_38758::path_option
          (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *path)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *path_local;
  
  uVar1 = pstore::command_line::option::get_num_occurrences(&path->super_option);
  if (uVar1 == 0) {
    pstore::nothing<std::__cxx11::string>();
  }
  else {
    this = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get(path);
    pstore::just<std::__cxx11::string_const&>(__return_storage_ptr__,(pstore *)this,value);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::maybe<std::string> path_option (opt<std::string> const & path) {
        if (path.get_num_occurrences () == 0U) {
            return pstore::nothing<std::string> ();
        }
        return pstore::just (path.get ());
    }